

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O3

int __thiscall pg::PSISolver::switch_strategy_seq(PSISolver *this,int pl)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  PSISolver *pPVar5;
  Game *pGVar6;
  Error *this_00;
  uint uVar7;
  uint uVar8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  _label_vertex local_70;
  int local_5c;
  long local_58;
  _label_vertex local_50;
  _label_vertex local_40;
  
  pGVar6 = (this->super_Solver).game;
  lVar4 = pGVar6->n_vertices;
  pPVar5 = this;
  if (lVar4 < 1) {
    iVar16 = 0;
LAB_001643d8:
    if ((pl == 0) && (0 < lVar4)) {
      lVar15 = 0;
      lVar9 = halt;
      do {
        if (*(int *)(lVar9 + lVar15 * 4) != 0) {
          bVar2 = si_val_less(pPVar5,-1,(int)lVar15);
          if (bVar2) {
            *(undefined4 *)(lVar9 + lVar15 * 4) = 0;
            if (1 < (this->super_Solver).trace) {
              poVar3 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,"\x1b[1;37mno longer halt\x1b[m before vertex ",0x27);
              local_70.g = (this->super_Solver).game;
              local_70.v = (int)lVar15;
              poVar3 = operator<<(poVar3,&local_70);
              std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
              pPVar5 = (PSISolver *)std::ostream::put((char)poVar3);
              std::ostream::flush();
              lVar4 = ((this->super_Solver).game)->n_vertices;
              lVar9 = halt;
            }
            iVar16 = iVar16 + 1;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar4);
    }
    return iVar16;
  }
  uVar12 = 0;
  iVar16 = 0;
LAB_00163f09:
  iVar1 = *(int *)(done + uVar12 * 4);
  if (iVar1 != 3) {
    if (iVar1 == 0) {
      this_00 = (Error *)__cxa_allocate_exception(0x40);
      Error::Error(this_00,"logic error",
                   "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/psi.cpp"
                   ,0x16c);
      __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
    }
    if ((uint)(((pGVar6->_owner)._bits[uVar12 >> 6] >> (uVar12 & 0x3f) & 1) != 0) != pl)
    goto LAB_001643c7;
    uVar7 = pGVar6->_outedges[pGVar6->_firstouts[uVar12]];
    if (uVar7 != 0xffffffff) {
      piVar10 = pGVar6->_outedges + pGVar6->_firstouts[uVar12];
      bVar13 = 0;
      uVar8 = *(uint *)(str + uVar12 * 4);
      lVar4 = str;
      local_5c = iVar16;
LAB_00163f7b:
      uVar14 = (ulong)(int)uVar7;
      if (((((this->super_Solver).disabled)->_bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) &&
         (uVar7 != uVar8)) {
        local_58 = (long)(int)uVar8;
        if (pl == 0) {
          bVar2 = si_val_less(pPVar5,-(uint)(*(int *)(halt + local_58 * 4) != 0) | uVar8,
                              -(uint)(*(int *)(halt + uVar14 * 4) != 0) | uVar7);
          if (!bVar2) goto LAB_00164390;
          if ((this->super_Solver).trace < 2) goto LAB_00164383;
          poVar3 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"\x1b[1;37mupdate even strategy\x1b[m \x1b[1;33m",0x26);
          local_70.g = (this->super_Solver).game;
          local_70.v = (int)uVar12;
          poVar3 = operator<<(poVar3,&local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m from \x1b[1;33m",0x10);
          local_40.g = (this->super_Solver).game;
          local_40.v = uVar8;
          poVar3 = operator<<(poVar3,&local_40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m (",5);
          lVar4 = (long)k;
          do {
            if (lVar4 < 1) {
              lVar4 = 0xffffffff;
              break;
            }
            lVar9 = lVar4 * 4;
            lVar4 = lVar4 + -1;
          } while (*(int *)(val + -4 + (long)(int)(uVar8 * k) * 4 + lVar9) == 0);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
          pcVar11 = ")H";
          bVar2 = *(int *)(halt + local_58 * 4) != 0;
          if (!bVar2) {
            pcVar11 = ")";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar11,(ulong)bVar2 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," to \x1b[1;33m",0xb);
          local_50.g = (this->super_Solver).game;
          local_50.v = uVar7;
          poVar3 = operator<<(poVar3,&local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m (",5);
          lVar4 = (long)k;
          do {
            if (lVar4 < 1) goto LAB_00164316;
            lVar9 = lVar4 * 4;
            lVar4 = lVar4 + -1;
          } while (*(int *)(val + -4 + (long)(int)(k * uVar7) * 4 + lVar9) == 0);
          goto LAB_0016431b;
        }
        bVar2 = si_val_less(pPVar5,-(uint)(*(int *)(halt + uVar14 * 4) != 0) | uVar7,
                            -(uint)(*(int *)(halt + local_58 * 4) != 0) | uVar8);
        if (!bVar2) goto LAB_00164390;
        if (1 < (this->super_Solver).trace) {
          poVar3 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"\x1b[1;37mupdate odd strategy\x1b[m \x1b[1;33m",0x25);
          local_70.g = (this->super_Solver).game;
          local_70.v = (int)uVar12;
          poVar3 = operator<<(poVar3,&local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m from \x1b[1;33m",0x10);
          local_40.g = (this->super_Solver).game;
          local_40.v = uVar8;
          poVar3 = operator<<(poVar3,&local_40);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m (",5);
          lVar4 = (long)k;
          do {
            if (lVar4 < 1) {
              lVar4 = 0xffffffff;
              break;
            }
            lVar9 = lVar4 * 4;
            lVar4 = lVar4 + -1;
          } while (*(int *)(val + -4 + (long)(int)(uVar8 * k) * 4 + lVar9) == 0);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
          pcVar11 = ")H";
          bVar2 = *(int *)(halt + local_58 * 4) != 0;
          if (!bVar2) {
            pcVar11 = ")";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar11,(ulong)bVar2 + 1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," to \x1b[1;33m",0xb);
          local_50.g = (this->super_Solver).game;
          local_50.v = uVar7;
          poVar3 = operator<<(poVar3,&local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\x1b[m (",5);
          lVar4 = (long)k;
          do {
            if (lVar4 < 1) goto LAB_00164316;
            lVar9 = lVar4 * 4;
            lVar4 = lVar4 + -1;
          } while (*(int *)(val + -4 + (long)(int)(k * uVar7) * 4 + lVar9) == 0);
          goto LAB_0016431b;
        }
        goto LAB_00164383;
      }
      goto LAB_00164390;
    }
    uVar7 = 0;
    goto LAB_001643c4;
  }
  goto LAB_001643c7;
LAB_00164316:
  lVar4 = 0xffffffff;
LAB_0016431b:
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)lVar4);
  pcVar11 = ")H";
  bVar2 = *(int *)(halt + uVar14 * 4) != 0;
  if (!bVar2) {
    pcVar11 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar11,(ulong)bVar2 + 1);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  pPVar5 = (PSISolver *)std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar4 = str;
LAB_00164383:
  bVar13 = 1;
  *(uint *)(lVar4 + uVar12 * 4) = uVar7;
  uVar8 = uVar7;
LAB_00164390:
  uVar7 = piVar10[1];
  piVar10 = piVar10 + 1;
  if (uVar7 == 0xffffffff) goto code_r0x001643a3;
  goto LAB_00163f7b;
code_r0x001643a3:
  uVar7 = (uint)bVar13;
  pGVar6 = (this->super_Solver).game;
  lVar4 = pGVar6->n_vertices;
  iVar16 = local_5c;
LAB_001643c4:
  iVar16 = iVar16 + uVar7;
LAB_001643c7:
  uVar12 = uVar12 + 1;
  if (lVar4 <= (long)uVar12) goto LAB_001643d8;
  goto LAB_00163f09;
}

Assistant:

int
PSISolver::switch_strategy_seq(int pl)
{
    int res = 0;

    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 3) continue; // skip "disabled or won"
        if (done[n] == 0) LOGIC_ERROR; // expecting done==1 or done==2
        if (owner(n) != pl) continue; // only change strategy for vertices of player <pl>

        bool changed = false;
        int cur_strat = str[n];
        for (auto curedge = outs(n); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue; // skip strategy to disabled
            if (to == cur_strat) continue; // skip strategy to same
            if (pl == 0) {
                // improving for player Even
                if (si_val_less(halt[cur_strat] ? -1 : cur_strat, halt[to] ? -1 : to)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate even strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            } else {
                // improving for player Odd
                if (si_val_less(halt[to] ? -1 : to, halt[cur_strat] ? -1 : cur_strat)) {
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;37mupdate odd strategy\033[m \033[1;33m" << label_vertex(n) << "\033[m from \033[1;33m" << label_vertex(cur_strat) << "\033[m (" << si_top_val(cur_strat) << (halt[cur_strat]?")H":")") << " to \033[1;33m" << label_vertex(to) << "\033[m (" << si_top_val(to) << (halt[to] ? ")H" : ")") << std::endl;
                    }
#endif
                    str[n] = cur_strat = to;
                    changed = true;
                }
            }
        }
        if (changed) res++;
    }

    if (pl == 0) {
        for (int n=0; n<nodecount(); n++) {
            if (halt[n] and si_val_less(-1, n)) {
                halt[n] = 0; // stop halting
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[1;37mno longer halt\033[m before vertex " << label_vertex(n) << std::endl;
                }
#endif
                res++;
            }
        }
    }

    return res;
}